

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O3

bool leveldb::GetVarint64(Slice *input,uint64_t *value)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  byte *pbVar4;
  bool bVar5;
  ulong uVar6;
  size_t sVar7;
  byte *pbVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  sVar7 = input->size_;
  if ((long)sVar7 < 1) {
    bVar5 = false;
  }
  else {
    pbVar1 = (byte *)(input->data_ + sVar7);
    uVar6 = 0;
    uVar9 = 0;
    pbVar4 = (byte *)input->data_;
    do {
      sVar7 = sVar7 - 1;
      pbVar8 = pbVar4 + 1;
      bVar2 = *pbVar4;
      if (-1 < (char)bVar2) {
        *value = (ulong)bVar2 << ((byte)uVar6 & 0x3f) | uVar9;
        input->data_ = (char *)pbVar8;
        input->size_ = sVar7;
        bVar5 = true;
        break;
      }
      bVar5 = false;
      if (0x38 < uVar6) break;
      uVar9 = uVar9 | (ulong)(bVar2 & 0x7f) << ((byte)uVar6 & 0x3f);
      uVar6 = uVar6 + 7;
      bVar5 = false;
      pbVar4 = pbVar8;
    } while (pbVar8 < pbVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool GetVarint64(Slice* input, uint64_t* value) {
  const char* p = input->data();
  const char* limit = p + input->size();
  const char* q = GetVarint64Ptr(p, limit, value);
  if (q == nullptr) {
    return false;
  } else {
    *input = Slice(q, limit - q);
    return true;
  }
}